

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

int fwd_aa_tab_clear(jit_State *J,IRRef lim,IRRef ta)

{
  IRIns *pIVar1;
  bool bVar2;
  AliasRet AVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (uint)J->chain[0x60];
  do {
    if (uVar5 <= lim) {
      return 1;
    }
    pIVar1 = (J->cur).ir;
    uVar4 = (ulong)uVar5;
    if ((*(short *)((long)pIVar1 + uVar4 * 8 + 2) == 0x1c) &&
       ((pIVar1[uVar4].field_0.op1 == ta ||
        (AVar3 = aa_table(J,ta,(uint)pIVar1[uVar4].field_0.op1), AVar3 != ALIAS_NO)))) {
      bVar2 = false;
    }
    else {
      uVar5 = (uint)*(ushort *)((long)pIVar1 + uVar4 * 8 + 6);
      bVar2 = true;
    }
  } while (bVar2);
  return 0;
}

Assistant:

static int fwd_aa_tab_clear(jit_State *J, IRRef lim, IRRef ta)
{
  IRRef ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *calls = IR(ref);
    if (calls->op2 == IRCALL_lj_tab_clear &&
	(ta == calls->op1 || aa_table(J, ta, calls->op1) != ALIAS_NO))
      return 0;  /* Conflict. */
    ref = calls->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}